

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel.cc
# Opt level: O0

void MULTILABEL::parse_label(parser *p,shared_data *param_2,void *v,v_array<substring> *words)

{
  substring s;
  size_t sVar1;
  v_array<unsigned_int> *pvVar2;
  size_t sVar3;
  substring *psVar4;
  ostream *poVar5;
  v_array<substring> *in_RCX;
  v_array<substring> *in_RDX;
  char *in_RSI;
  long in_RDI;
  size_t i_1;
  uint32_t n;
  size_t i;
  labels *ld;
  uint *in_stack_ffffffffffffff98;
  v_array<unsigned_int> *in_stack_ffffffffffffffa0;
  v_array<unsigned_int> *this;
  size_t local_50;
  v_array<unsigned_int> *local_40;
  v_array<substring> *pvVar6;
  
  pvVar6 = in_RDX;
  v_array<unsigned_int>::clear(in_stack_ffffffffffffffa0);
  sVar1 = v_array<substring>::size(in_RCX);
  if (sVar1 != 0) {
    if (sVar1 == 1) {
      psVar4 = v_array<substring>::operator[](in_RCX,0);
      s.end = in_RSI;
      s.begin = (char *)pvVar6;
      tokenize<v_array<substring>>
                ((char)((ulong)in_RCX >> 0x38),s,in_RDX,SUB81((ulong)psVar4->end >> 0x38,0));
      local_40 = (v_array<unsigned_int> *)0x0;
      while (this = local_40,
            pvVar2 = (v_array<unsigned_int> *)
                     v_array<substring>::size((v_array<substring> *)(in_RDI + 0x310)), this < pvVar2
            ) {
        psVar4 = v_array<substring>::operator[]
                           ((v_array<substring> *)(in_RDI + 0x310),(size_t)local_40);
        *psVar4->end = '\0';
        psVar4 = v_array<substring>::operator[]
                           ((v_array<substring> *)(in_RDI + 0x310),(size_t)local_40);
        atoi(psVar4->begin);
        v_array<unsigned_int>::push_back(this,in_stack_ffffffffffffff98);
        local_40 = (v_array<unsigned_int> *)((long)&local_40->_begin + 1);
      }
    }
    else {
      std::operator<<((ostream *)&std::cerr,"example with an odd label, what is ");
      local_50 = 0;
      while (sVar1 = local_50, sVar3 = v_array<substring>::size(in_RCX), sVar1 < sVar3) {
        psVar4 = v_array<substring>::operator[](in_RCX,local_50);
        poVar5 = std::operator<<((ostream *)&std::cerr,psVar4->begin);
        std::operator<<(poVar5," ");
        local_50 = local_50 + 1;
      }
      std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void parse_label(parser* p, shared_data*, void* v, v_array<substring>& words)
{
  labels* ld = (labels*)v;

  ld->label_v.clear();
  switch (words.size())
  {
    case 0:
      break;
    case 1:
      tokenize(',', words[0], p->parse_name);

      for (size_t i = 0; i < p->parse_name.size(); i++)
      {
        *(p->parse_name[i].end) = '\0';
        uint32_t n = atoi(p->parse_name[i].begin);
        ld->label_v.push_back(n);
      }
      break;
    default:
      cerr << "example with an odd label, what is ";
      for (size_t i = 0; i < words.size(); i++) cerr << words[i].begin << " ";
      cerr << endl;
  }
}